

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  printf("x = %.2f\n",0x4014000000000000);
  printf("y = %.2f\n",0x4024800000000000);
  printf("z = %.2f\n",0xc015000000000000);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  int a, b;
  float x, y, z;
  a = 2;
  b = 9;
  a = b / a; // a = 4
  x = (float)(a + b % a); // x = 5.0
  y = (float)b + x / 4; // y = 10.25
  z = x - y; // z = -5.25
  printf("x = %.2f\n", x);
  printf("y = %.2f\n", y);
  printf("z = %.2f\n", z);

  return 0;
}